

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::NopZeroXFixture>::
AddTestPattern(ParameterizedTestSuiteInfo<(anonymous_namespace)::NopZeroXFixture> *this,
              char *test_suite_name,char *test_base_name,
              TestMetaFactoryBase<unsigned_char> *meta_factory,CodeLocation *code_location)

{
  CodeLocation *a_test_meta_factory;
  TestMetaFactoryBase<unsigned_char> *a_test_base_name;
  char *a_test_suite_base_name;
  TestInfo *this_00;
  CodeLocation local_68;
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::NopZeroXFixture>::TestInfo>
  local_40;
  CodeLocation *local_30;
  CodeLocation *code_location_local;
  TestMetaFactoryBase<unsigned_char> *meta_factory_local;
  char *test_base_name_local;
  char *test_suite_name_local;
  ParameterizedTestSuiteInfo<(anonymous_namespace)::NopZeroXFixture> *this_local;
  
  local_30 = code_location;
  code_location_local = (CodeLocation *)meta_factory;
  meta_factory_local = (TestMetaFactoryBase<unsigned_char> *)test_base_name;
  test_base_name_local = test_suite_name;
  test_suite_name_local = (char *)this;
  this_00 = (TestInfo *)operator_new(0x70);
  a_test_suite_base_name = test_base_name_local;
  a_test_base_name = meta_factory_local;
  a_test_meta_factory = code_location_local;
  CodeLocation::CodeLocation(&local_68,code_location);
  TestInfo::TestInfo(this_00,a_test_suite_base_name,(char *)a_test_base_name,
                     (TestMetaFactoryBase<unsigned_char> *)a_test_meta_factory,&local_68);
  std::
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::NopZeroXFixture>::TestInfo>
  ::
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::NopZeroXFixture>::TestInfo,void>
            (&local_40,this_00);
  std::
  vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::NopZeroXFixture>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::NopZeroXFixture>::TestInfo>_>_>
  ::push_back(&this->tests_,&local_40);
  std::
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::NopZeroXFixture>::TestInfo>
  ::~shared_ptr(&local_40);
  CodeLocation::~CodeLocation(&local_68);
  return;
}

Assistant:

void AddTestPattern(const char* test_suite_name, const char* test_base_name,
                      TestMetaFactoryBase<ParamType>* meta_factory,
                      CodeLocation code_location) {
    tests_.push_back(std::shared_ptr<TestInfo>(new TestInfo(
        test_suite_name, test_base_name, meta_factory, code_location)));
  }